

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_simulate.c
# Opt level: O0

void picnic3_mpc_sbox_s128_lowmc_129_129_4(mzd_local_t *statein,randomTape_t *tapes,msgs_t *msgs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  long in_RDX;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i carry_11;
  __m128i total_carry_11;
  __m128i carry_10;
  __m128i total_carry_10;
  __m128i carry_9;
  __m128i total_carry_9;
  __m128i carry_8;
  __m128i total_carry_8;
  __m128i carry_7;
  __m128i total_carry_7;
  __m128i carry_6;
  __m128i total_carry_6;
  word128 and_helper_ca [2];
  word128 and_helper_bc [2];
  word128 and_helper_ab [2];
  __m128i carry_5;
  __m128i total_carry_5;
  __m128i carry_4;
  __m128i total_carry_4;
  word128 mask_c [2];
  word128 mask_b [2];
  word128 mask_a [2];
  bitstream_t party_tape;
  __m128i carry_3;
  __m128i total_carry_3;
  __m128i carry_2;
  __m128i total_carry_2;
  bitstream_t party_msgs;
  int i;
  word128 s_ca [2];
  word128 s_bc [2];
  word128 s_ab [2];
  word128 t2 [2];
  word128 t1 [2];
  word128 t0 [2];
  __m128i carry_1;
  __m128i total_carry_1;
  __m128i carry;
  __m128i total_carry;
  word128 c [2];
  word128 b [2];
  word128 a [2];
  word128 bitm_c [2];
  word128 bitm_b [2];
  word128 bitm_a [2];
  word128 tmp [2];
  size_t local_1f08;
  undefined1 in_stack_ffffffffffffe108 [16];
  undefined1 in_stack_ffffffffffffe118 [16];
  undefined8 local_1ed8;
  undefined8 uStack_1ed0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  undefined1 local_1e68 [16];
  undefined1 local_1e58 [16];
  undefined1 local_1e48 [16];
  undefined1 local_1e38 [16];
  undefined1 local_1e28 [16];
  undefined1 local_1e18 [16];
  undefined1 local_1e08 [16];
  undefined1 local_1df8 [16];
  undefined1 local_1de8 [16];
  undefined1 local_1dd8 [16];
  undefined1 local_1dc8 [16];
  undefined1 local_1db8 [16];
  undefined1 local_1da8 [16];
  undefined1 local_1d98 [16];
  undefined1 local_1d88 [16];
  undefined1 local_1d78 [16];
  undefined8 local_1d68;
  ulong local_1d60;
  undefined1 local_1d58 [16];
  undefined1 local_1d48 [16];
  undefined1 local_1d38 [16];
  undefined1 local_1d28 [16];
  undefined8 local_1d10;
  undefined8 local_1d08;
  int local_1cfc;
  undefined1 local_1cf8 [16];
  undefined1 local_1ce8 [16];
  undefined1 local_1cd8 [16];
  undefined1 local_1cc8 [16];
  undefined1 local_1cb8 [16];
  undefined1 local_1ca8 [16];
  undefined1 local_1c98 [16];
  undefined1 local_1c88 [16];
  undefined1 local_1c78 [16];
  undefined1 local_1c68 [16];
  undefined1 local_1c58 [16];
  undefined1 local_1c48 [16];
  undefined1 local_1c38 [16];
  undefined1 local_1c28 [16];
  undefined1 local_1c18 [16];
  undefined1 local_1c08 [16];
  undefined1 local_1bf8 [16];
  undefined1 local_1be8 [16];
  undefined1 local_1bd8 [16];
  undefined1 local_1bc8 [16];
  undefined1 local_1bb8 [16];
  undefined1 local_1ba8 [16];
  word local_1b98;
  word wStack_1b90;
  word local_1b88;
  word wStack_1b80;
  word local_1b78;
  word wStack_1b70;
  word local_1b68;
  word wStack_1b60;
  word local_1b58;
  word wStack_1b50;
  word local_1b48;
  word wStack_1b40;
  ulong local_1b38;
  ulong uStack_1b30;
  ulong local_1b28;
  ulong uStack_1b20;
  long local_1b10;
  long local_1b08;
  undefined1 (*local_1b00) [16];
  undefined8 local_1af8;
  mzd_local_t *local_1af0;
  undefined8 local_1ae8;
  mzd_local_t *local_1ae0;
  undefined8 local_1ad8;
  mzd_local_t *local_1ad0;
  undefined1 (*local_1ac8) [16];
  undefined1 *local_1ab8;
  undefined1 *local_1ab0;
  undefined1 *local_1aa8;
  undefined1 *local_1aa0;
  undefined1 *local_1a98;
  undefined1 *local_1a90;
  undefined1 *local_1a88;
  undefined1 *local_1a80;
  undefined1 *local_1a78;
  undefined1 *local_1a70;
  undefined1 *local_1a68;
  undefined1 *local_1a60;
  undefined1 *local_1a58;
  undefined1 *local_1a50;
  undefined1 *local_1a48;
  undefined1 *local_1a40;
  undefined1 *local_1a38;
  undefined1 *local_1a30;
  ulong *local_1a28;
  word *local_1a20;
  undefined1 *local_1a18;
  ulong *local_1a10;
  word *local_1a08;
  undefined1 *local_1a00;
  ulong *local_19f8;
  word *local_19f0;
  undefined1 *local_19e8;
  ulong *local_19e0;
  word *local_19d8;
  undefined1 *local_19d0;
  ulong *local_19c8;
  word *local_19c0;
  undefined1 *local_19b8;
  ulong *local_19b0;
  word *local_19a8;
  undefined1 *local_19a0;
  ulong *local_1998;
  word *local_1990;
  undefined1 *local_1988;
  ulong *local_1980;
  word *local_1978;
  undefined1 *local_1970;
  ulong *local_1968;
  word *local_1960;
  undefined1 *local_1958;
  undefined1 *local_1950;
  undefined1 *local_1948;
  undefined1 *local_1940;
  undefined1 *local_1938;
  undefined1 *local_1930;
  undefined1 *local_1928;
  undefined1 *local_1920;
  undefined1 *local_1918;
  undefined1 *local_1910;
  ulong *local_1908;
  word *local_1900;
  undefined1 *local_18f8;
  ulong *local_18f0;
  word *local_18e8;
  undefined1 *local_18e0;
  ulong *local_18d8;
  word *local_18d0;
  undefined1 *local_18c8;
  undefined4 local_183c;
  ulong local_1838;
  ulong uStack_1830;
  undefined4 local_181c;
  ulong local_1818;
  ulong uStack_1810;
  undefined4 local_17fc;
  ulong local_17f8;
  ulong uStack_17f0;
  undefined4 local_17dc;
  ulong local_17d8;
  ulong uStack_17d0;
  undefined4 local_17bc;
  undefined1 local_17b8 [16];
  undefined4 local_179c;
  undefined1 local_1798 [16];
  undefined4 local_177c;
  undefined1 local_1778 [16];
  undefined4 local_175c;
  undefined1 local_1758 [16];
  undefined4 local_173c;
  undefined1 local_1738 [16];
  undefined4 local_171c;
  undefined1 local_1718 [16];
  undefined4 local_16fc;
  undefined1 local_16f8 [16];
  undefined4 local_16dc;
  undefined1 local_16d8 [16];
  undefined4 local_16bc;
  undefined1 local_16b8 [16];
  undefined4 local_169c;
  undefined1 local_1698 [16];
  undefined4 local_167c;
  undefined1 local_1678 [16];
  undefined4 local_165c;
  undefined1 local_1658 [16];
  undefined4 local_163c;
  undefined1 local_1638 [16];
  undefined4 local_161c;
  undefined1 local_1618 [16];
  undefined4 local_15fc;
  undefined1 local_15f8 [16];
  undefined4 local_15dc;
  undefined1 local_15d8 [16];
  undefined4 local_15bc;
  undefined1 local_15b8 [16];
  undefined4 local_159c;
  undefined1 local_1598 [16];
  undefined4 local_157c;
  undefined1 local_1578 [16];
  undefined4 local_155c;
  undefined1 local_1558 [16];
  undefined4 local_153c;
  undefined1 local_1538 [16];
  undefined4 local_151c;
  undefined1 local_1518 [16];
  undefined4 local_14fc;
  undefined1 local_14f8 [16];
  undefined4 local_14dc;
  undefined1 local_14d8 [16];
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  bitstream_t *local_13e8;
  undefined8 uStack_13e0;
  undefined1 local_13d8 [16];
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined1 local_13b8 [16];
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined1 local_1378 [16];
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined1 local_1358 [16];
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined1 local_1318 [16];
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined1 local_12f8 [16];
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined1 local_12b8 [16];
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined1 local_1298 [16];
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined1 local_1258 [16];
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined1 local_1238 [16];
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined1 local_11f8 [16];
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined1 local_11d8 [16];
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined1 local_1198 [16];
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined1 local_1178 [16];
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined1 local_1138 [16];
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined1 local_1118 [16];
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined1 local_10d8 [16];
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined1 local_10b8 [16];
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined1 local_1078 [16];
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined1 local_1058 [16];
  undefined4 local_f7c;
  undefined1 local_f78 [16];
  undefined4 local_f5c;
  undefined1 local_f58 [16];
  undefined4 local_f3c;
  undefined1 local_f38 [16];
  undefined4 local_f1c;
  undefined1 local_f18 [16];
  undefined4 local_efc;
  undefined1 local_ef8 [16];
  undefined4 local_edc;
  undefined1 local_ed8 [16];
  undefined4 local_ebc;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined4 local_e9c;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined4 local_e7c;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined4 local_e5c;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined4 local_e3c;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined4 local_e1c;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined4 local_dfc;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined4 local_ddc;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined4 local_dbc;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined4 local_d9c;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined4 local_d7c;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined4 local_d5c;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined4 local_d3c;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined4 local_d1c;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined4 local_cfc;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined4 local_cdc;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined1 *local_c18;
  ulong *local_c10;
  ulong *local_c08;
  undefined1 *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  undefined1 *local_be8;
  undefined1 *local_be0;
  undefined1 *local_bd8;
  undefined1 *local_bd0;
  undefined1 *local_bc8;
  undefined1 *local_bc0;
  undefined1 *local_bb8;
  ulong *local_bb0;
  ulong *local_ba8;
  undefined1 *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  undefined1 *local_b88;
  undefined1 *local_b80;
  undefined1 *local_b78;
  undefined1 *local_b70;
  undefined1 *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  ulong *local_b50;
  undefined1 *local_b48;
  undefined1 *local_b40;
  undefined1 *local_b38;
  ulong *local_b30;
  undefined1 *local_b28;
  undefined1 *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  undefined1 *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  undefined1 *local_ae8;
  undefined1 *local_ae0;
  undefined1 *local_ad8;
  undefined1 *local_ad0;
  ulong local_a68;
  ulong uStack_a60;
  word local_a58;
  word wStack_a50;
  ulong local_a48;
  ulong uStack_a40;
  word local_a38;
  word wStack_a30;
  ulong local_a28;
  ulong uStack_a20;
  word local_a18;
  word wStack_a10;
  ulong local_a08;
  ulong uStack_a00;
  word local_9f8;
  word wStack_9f0;
  ulong local_9e8;
  ulong uStack_9e0;
  word local_9d8;
  word wStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  ulong local_908;
  ulong uStack_900;
  word local_8f8;
  word wStack_8f0;
  ulong local_8e8;
  ulong uStack_8e0;
  word local_8d8;
  word wStack_8d0;
  ulong local_8c8;
  ulong uStack_8c0;
  word local_8b8;
  word wStack_8b0;
  ulong local_8a8;
  ulong uStack_8a0;
  word local_898;
  word wStack_890;
  ulong local_888;
  ulong uStack_880;
  word local_878;
  word wStack_870;
  ulong local_868;
  ulong uStack_860;
  word local_858;
  word wStack_850;
  ulong local_848;
  ulong uStack_840;
  word local_838;
  word wStack_830;
  ulong local_828;
  ulong uStack_820;
  word local_818;
  word wStack_810;
  ulong local_808;
  ulong uStack_800;
  word local_7f8;
  word wStack_7f0;
  ulong local_7e8;
  ulong uStack_7e0;
  word local_7d8;
  word wStack_7d0;
  ulong local_7c8;
  ulong uStack_7c0;
  word local_7b8;
  word wStack_7b0;
  ulong local_7a8;
  ulong uStack_7a0;
  word local_798;
  word wStack_790;
  ulong local_788;
  ulong uStack_780;
  word local_778;
  word wStack_770;
  ulong local_768;
  ulong uStack_760;
  word local_758;
  word wStack_750;
  ulong local_748;
  ulong uStack_740;
  word local_738;
  word wStack_730;
  ulong local_728;
  ulong uStack_720;
  word local_718;
  word wStack_710;
  ulong local_708;
  ulong uStack_700;
  word local_6f8;
  word wStack_6f0;
  ulong local_6e8;
  ulong uStack_6e0;
  word local_6d8;
  word wStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  ulong local_548;
  ulong uStack_540;
  ulong local_538;
  ulong uStack_530;
  ulong local_528;
  ulong uStack_520;
  ulong local_518;
  ulong uStack_510;
  ulong local_508;
  ulong uStack_500;
  ulong local_4f8;
  ulong uStack_4f0;
  ulong local_4e8;
  ulong uStack_4e0;
  ulong local_4d8;
  ulong uStack_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  ulong local_4a8;
  ulong uStack_4a0;
  ulong local_498;
  ulong uStack_490;
  ulong local_488;
  ulong uStack_480;
  ulong local_478;
  ulong uStack_470;
  ulong local_468;
  ulong uStack_460;
  ulong local_458;
  ulong uStack_450;
  ulong local_448;
  ulong uStack_440;
  ulong local_438;
  ulong uStack_430;
  ulong local_428;
  ulong uStack_420;
  ulong local_418;
  ulong uStack_410;
  ulong local_408;
  ulong uStack_400;
  ulong local_3f8;
  ulong uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  ulong local_3d8;
  ulong uStack_3d0;
  ulong local_3c8;
  ulong uStack_3c0;
  ulong local_3b8;
  ulong uStack_3b0;
  ulong local_3a8;
  ulong uStack_3a0;
  ulong local_398;
  ulong uStack_390;
  ulong local_388;
  ulong uStack_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  ulong local_358;
  ulong uStack_350;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  ulong uStack_310;
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  ulong local_288;
  ulong uStack_280;
  ulong local_278;
  ulong uStack_270;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  ulong uStack_240;
  ulong local_238;
  ulong uStack_230;
  ulong local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  
  local_1b38 = *(ulong *)*in_RDI;
  uStack_1b30 = *(ulong *)(*in_RDI + 8);
  local_1ac8 = in_RDI + 1;
  local_a48 = *(ulong *)*local_1ac8;
  uStack_a40 = *(ulong *)(in_RDI[1] + 8);
  local_1ad0 = mask_129_129_43_a;
  local_1b58 = 0x8000000000000000;
  wStack_1b50 = 0x4924924924924924;
  local_1ad8 = 0x22b270;
  local_1ae0 = mask_129_129_43_b;
  local_1b78 = 0;
  wStack_1b70 = 0x9249249249249249;
  local_1ae8 = 0x22b290;
  local_1b68 = 0x4924924924924924;
  wStack_1b60 = 0;
  local_1af0 = mask_129_129_43_c;
  local_1b98 = 0;
  wStack_1b90 = 0x2492492492492492;
  local_1af8 = 0x22b2b0;
  local_1b88 = 0x9249249249249249;
  wStack_1b80 = 0;
  local_18c8 = local_1bb8;
  local_18d0 = &local_1b58;
  local_18d8 = &local_1b38;
  local_a58 = 0x8000000000000000;
  wStack_a50 = 0x4924924924924924;
  auVar37._8_8_ = 0x4924924924924924;
  auVar37._0_8_ = 0x8000000000000000;
  auVar37 = vpand_avx(auVar37,*in_RDI);
  auVar39._8_8_ = wStack_1b40;
  auVar39._0_8_ = local_1b48;
  auVar38._8_8_ = uStack_1b20;
  auVar38._0_8_ = local_1b28;
  auVar39 = vpand_avx(auVar39,auVar38);
  local_18e0 = local_1bd8;
  local_18e8 = &local_1b78;
  local_18f0 = &local_1b38;
  local_a18 = 0;
  wStack_a10 = 0x9249249249249249;
  auVar38 = vpand_avx(ZEXT816(0x9249249249249249) << 0x40,*in_RDI);
  local_a38 = 0x4924924924924924;
  wStack_a30 = 0;
  auVar40 = vpand_avx(ZEXT816(0x4924924924924924),*local_1ac8);
  local_18f8 = local_1bf8;
  local_1900 = &local_1b98;
  local_1908 = &local_1b38;
  local_9d8 = 0;
  wStack_9d0 = 0x2492492492492492;
  local_1bf8 = vpand_avx(ZEXT816(0x2492492492492492) << 0x40,*in_RDI);
  local_9f8 = 0x9249249249249249;
  wStack_9f0 = 0;
  local_1be8 = vpand_avx(ZEXT816(0x9249249249249249),*local_1ac8);
  local_14d8 = vpsrldq_avx(auVar37,8);
  local_14dc = 0x3e;
  local_1c08 = vpsrlq_avx(local_14d8,ZEXT416(0x3e));
  local_14f8 = vpslldq_avx(auVar37,8);
  local_14fc = 0x3e;
  auVar1 = vpsrlq_avx(local_14f8,ZEXT416(0x3e));
  local_1bb8._0_8_ = auVar37._0_8_;
  local_1bb8._8_8_ = auVar37._8_8_;
  local_cd8 = local_1bb8._0_8_;
  uStack_cd0 = local_1bb8._8_8_;
  local_cdc = 2;
  local_1058 = vpsllq_avx(auVar37,ZEXT416(2));
  local_1c18._0_8_ = auVar1._0_8_;
  local_1c18._8_8_ = auVar1._8_8_;
  local_1068 = local_1c18._0_8_;
  uStack_1060 = local_1c18._8_8_;
  local_1bb8 = vpor_avx(local_1058,auVar1);
  local_1518 = vpslldq_avx(auVar39,8);
  local_151c = 0x3e;
  local_1c18 = vpsrlq_avx(local_1518,ZEXT416(0x3e));
  local_1ba8._0_8_ = auVar39._0_8_;
  local_1ba8._8_8_ = auVar39._8_8_;
  local_cf8 = local_1ba8._0_8_;
  uStack_cf0 = local_1ba8._8_8_;
  local_cfc = 2;
  local_1078 = vpsllq_avx(auVar39,ZEXT416(2));
  local_1088 = local_1c18._0_8_;
  uStack_1080 = local_1c18._8_8_;
  auVar37 = vpor_avx(local_1078,local_1c18);
  local_1ba8._0_8_ = auVar37._0_8_;
  local_1ba8._8_8_ = auVar37._8_8_;
  local_1098 = local_1ba8._0_8_;
  uStack_1090 = local_1ba8._8_8_;
  local_10a8 = local_1c08._0_8_;
  uStack_10a0 = local_1c08._8_8_;
  local_1ba8 = vpor_avx(auVar37,local_1c08);
  local_1538 = vpsrldq_avx(auVar38,8);
  local_153c = 0x3f;
  local_1c28 = vpsrlq_avx(local_1538,ZEXT416(0x3f));
  local_1558 = vpslldq_avx(auVar38,8);
  local_155c = 0x3f;
  auVar37 = vpsrlq_avx(local_1558,ZEXT416(0x3f));
  local_1bd8._0_8_ = auVar38._0_8_;
  local_1bd8._8_8_ = auVar38._8_8_;
  local_d18 = local_1bd8._0_8_;
  uStack_d10 = local_1bd8._8_8_;
  local_d1c = 1;
  local_10b8 = vpsllq_avx(auVar38,ZEXT416(1));
  local_1c38._0_8_ = auVar37._0_8_;
  local_1c38._8_8_ = auVar37._8_8_;
  local_10c8 = local_1c38._0_8_;
  uStack_10c0 = local_1c38._8_8_;
  local_1bd8 = vpor_avx(local_10b8,auVar37);
  local_1578 = vpslldq_avx(auVar40,8);
  local_157c = 0x3f;
  local_1c38 = vpsrlq_avx(local_1578,ZEXT416(0x3f));
  local_1bc8._0_8_ = auVar40._0_8_;
  local_9b8 = local_1bc8._0_8_;
  local_1bc8._8_8_ = auVar40._8_8_;
  uStack_9b0 = local_1bc8._8_8_;
  local_d38 = local_1bc8._0_8_;
  uStack_d30 = local_1bc8._8_8_;
  local_d3c = 1;
  local_10d8 = vpsllq_avx(auVar40,ZEXT416(1));
  local_10e8 = local_1c38._0_8_;
  uStack_10e0 = local_1c38._8_8_;
  auVar37 = vpor_avx(local_10d8,local_1c38);
  local_1bc8._0_8_ = auVar37._0_8_;
  local_1bc8._8_8_ = auVar37._8_8_;
  local_10f8 = local_1bc8._0_8_;
  uStack_10f0 = local_1bc8._8_8_;
  local_1108 = local_1c28._0_8_;
  uStack_1100 = local_1c28._8_8_;
  local_1bc8 = vpor_avx(auVar37,local_1c28);
  local_1910 = local_1cd8;
  local_1918 = local_1bd8;
  local_1920 = local_1bf8;
  local_998 = local_1bd8._0_8_;
  uStack_990 = local_1bd8._8_8_;
  local_9a8 = local_1bf8._0_8_;
  uStack_9a0 = local_1bf8._8_8_;
  local_1cd8 = vpand_avx(local_1bd8,local_1bf8);
  local_9c8 = local_1be8._0_8_;
  uStack_9c0 = local_1be8._8_8_;
  local_1cc8 = vpand_avx(auVar40,local_1be8);
  local_1928 = local_1cf8;
  local_1930 = local_1bf8;
  local_1938 = local_1bb8;
  local_958 = local_1bf8._0_8_;
  uStack_950 = local_1bf8._8_8_;
  local_968 = local_1bb8._0_8_;
  uStack_960 = local_1bb8._8_8_;
  local_1cf8 = vpand_avx(local_1bf8,local_1bb8);
  local_978 = local_1be8._0_8_;
  uStack_970 = local_1be8._8_8_;
  local_988 = local_1ba8._0_8_;
  uStack_980 = local_1ba8._8_8_;
  local_1ce8 = vpand_avx(local_1be8,local_1ba8);
  local_1940 = local_1cb8;
  local_1948 = local_1bb8;
  local_1950 = local_1bd8;
  local_918 = local_1bb8._0_8_;
  uStack_910 = local_1bb8._8_8_;
  local_928 = local_1bd8._0_8_;
  uStack_920 = local_1bd8._8_8_;
  local_1cb8 = vpand_avx(local_1bb8,local_1bd8);
  local_938 = local_1ba8._0_8_;
  uStack_930 = local_1ba8._8_8_;
  local_948 = local_1bc8._0_8_;
  uStack_940 = local_1bc8._8_8_;
  local_1ca8 = vpand_avx(local_1ba8,local_1bc8);
  local_1b48 = 0x2492492492492492;
  wStack_1b40 = 0;
  local_1b28 = local_a48;
  uStack_1b20 = uStack_a40;
  local_1b10 = in_RDX;
  local_1b08 = in_RSI;
  local_1b00 = in_RDI;
  local_a68 = local_1b38;
  uStack_a60 = uStack_1b30;
  local_a28 = local_1b38;
  uStack_a20 = uStack_1b30;
  local_a08 = local_a48;
  uStack_a00 = uStack_a40;
  local_9e8 = local_1b38;
  uStack_9e0 = uStack_1b30;
  for (local_1cfc = 0; local_1cfc < 0x10; local_1cfc = local_1cfc + 1) {
    local_1d10 = *(undefined8 *)(local_1b10 + (long)local_1cfc * 8);
    local_1d08 = *(undefined8 *)(local_1b10 + 0x80);
    if (local_1cfc == *(int *)(local_1b10 + 0x88)) {
      w128_from_bitstream(in_stack_ffffffffffffe118._8_8_,in_stack_ffffffffffffe118._0_8_,
                          in_stack_ffffffffffffe108._8_8_,in_stack_ffffffffffffe108._0_8_);
      local_1958 = local_1c58;
      local_1960 = &local_1b58;
      local_1968 = &local_1b38;
      local_8d8 = local_1b58;
      wStack_8d0 = wStack_1b50;
      auVar7._8_8_ = wStack_1b50;
      auVar7._0_8_ = local_1b58;
      local_8e8 = local_1b38;
      uStack_8e0 = uStack_1b30;
      auVar10._8_8_ = uStack_1b30;
      auVar10._0_8_ = local_1b38;
      auVar37 = vpand_avx(auVar7,auVar10);
      local_8f8 = local_1b48;
      wStack_8f0 = wStack_1b40;
      auVar25._8_8_ = wStack_1b40;
      auVar25._0_8_ = local_1b48;
      local_908 = local_1b28;
      uStack_900 = uStack_1b20;
      auVar28._8_8_ = uStack_1b20;
      auVar28._0_8_ = local_1b28;
      auVar39 = vpand_avx(auVar25,auVar28);
      local_1970 = local_1c78;
      local_1978 = &local_1b78;
      local_1980 = &local_1b38;
      local_898 = local_1b78;
      wStack_890 = wStack_1b70;
      auVar5._8_8_ = wStack_1b70;
      auVar5._0_8_ = local_1b78;
      local_8a8 = local_1b38;
      uStack_8a0 = uStack_1b30;
      auVar11._8_8_ = uStack_1b30;
      auVar11._0_8_ = local_1b38;
      auVar38 = vpand_avx(auVar5,auVar11);
      local_8b8 = local_1b68;
      wStack_8b0 = wStack_1b60;
      auVar22._8_8_ = wStack_1b60;
      auVar22._0_8_ = local_1b68;
      local_8c8 = local_1b28;
      uStack_8c0 = uStack_1b20;
      auVar29._8_8_ = uStack_1b20;
      auVar29._0_8_ = local_1b28;
      auVar40 = vpand_avx(auVar22,auVar29);
      local_1988 = local_1c98;
      local_1990 = &local_1b98;
      local_1998 = &local_1b38;
      local_858 = local_1b98;
      wStack_850 = wStack_1b90;
      auVar4._8_8_ = wStack_1b90;
      auVar4._0_8_ = local_1b98;
      local_868 = local_1b38;
      uStack_860 = uStack_1b30;
      auVar12._8_8_ = uStack_1b30;
      auVar12._0_8_ = local_1b38;
      local_1c98 = vpand_avx(auVar4,auVar12);
      local_878 = local_1b88;
      wStack_870 = wStack_1b80;
      auVar19._8_8_ = wStack_1b80;
      auVar19._0_8_ = local_1b88;
      local_888 = local_1b28;
      uStack_880 = uStack_1b20;
      auVar30._8_8_ = uStack_1b20;
      auVar30._0_8_ = local_1b28;
      local_1c88 = vpand_avx(auVar19,auVar30);
      local_1598 = vpsrldq_avx(auVar37,8);
      local_159c = 0x3e;
      local_1d28 = vpsrlq_avx(local_1598,ZEXT416(0x3e));
      local_15b8 = vpslldq_avx(auVar37,8);
      local_15bc = 0x3e;
      auVar1 = vpsrlq_avx(local_15b8,ZEXT416(0x3e));
      local_1c58._0_8_ = auVar37._0_8_;
      local_1c58._8_8_ = auVar37._8_8_;
      local_d58 = local_1c58._0_8_;
      uStack_d50 = local_1c58._8_8_;
      local_d5c = 2;
      local_1118 = vpsllq_avx(auVar37,ZEXT416(2));
      local_1d38._0_8_ = auVar1._0_8_;
      local_1d38._8_8_ = auVar1._8_8_;
      local_1128 = local_1d38._0_8_;
      uStack_1120 = local_1d38._8_8_;
      local_1c58 = vpor_avx(local_1118,auVar1);
      local_15d8 = vpslldq_avx(auVar39,8);
      local_15dc = 0x3e;
      local_1d38 = vpsrlq_avx(local_15d8,ZEXT416(0x3e));
      local_1c48._0_8_ = auVar39._0_8_;
      local_1c48._8_8_ = auVar39._8_8_;
      local_d78 = local_1c48._0_8_;
      uStack_d70 = local_1c48._8_8_;
      local_d7c = 2;
      local_1138 = vpsllq_avx(auVar39,ZEXT416(2));
      local_1148 = local_1d38._0_8_;
      uStack_1140 = local_1d38._8_8_;
      auVar37 = vpor_avx(local_1138,local_1d38);
      local_1c48._0_8_ = auVar37._0_8_;
      local_1c48._8_8_ = auVar37._8_8_;
      local_1158 = local_1c48._0_8_;
      uStack_1150 = local_1c48._8_8_;
      local_1168 = local_1d28._0_8_;
      uStack_1160 = local_1d28._8_8_;
      local_1c48 = vpor_avx(auVar37,local_1d28);
      local_15f8 = vpsrldq_avx(auVar38,8);
      local_15fc = 0x3f;
      local_1d48 = vpsrlq_avx(local_15f8,ZEXT416(0x3f));
      local_1618 = vpslldq_avx(auVar38,8);
      local_161c = 0x3f;
      auVar37 = vpsrlq_avx(local_1618,ZEXT416(0x3f));
      local_1c78._0_8_ = auVar38._0_8_;
      local_1c78._8_8_ = auVar38._8_8_;
      local_d98 = local_1c78._0_8_;
      uStack_d90 = local_1c78._8_8_;
      local_d9c = 1;
      local_1178 = vpsllq_avx(auVar38,ZEXT416(1));
      local_1d58._0_8_ = auVar37._0_8_;
      local_1d58._8_8_ = auVar37._8_8_;
      local_1188 = local_1d58._0_8_;
      uStack_1180 = local_1d58._8_8_;
      local_1c78 = vpor_avx(local_1178,auVar37);
      local_1638 = vpslldq_avx(auVar40,8);
      local_163c = 0x3f;
      local_1d58 = vpsrlq_avx(local_1638,ZEXT416(0x3f));
      local_1c68._0_8_ = auVar40._0_8_;
      local_1c68._8_8_ = auVar40._8_8_;
      local_db8 = local_1c68._0_8_;
      uStack_db0 = local_1c68._8_8_;
      local_dbc = 1;
      local_1198 = vpsllq_avx(auVar40,ZEXT416(1));
      local_11a8 = local_1d58._0_8_;
      uStack_11a0 = local_1d58._8_8_;
      auVar37 = vpor_avx(local_1198,local_1d58);
      local_1c68._0_8_ = auVar37._0_8_;
      local_1c68._8_8_ = auVar37._8_8_;
      local_11b8 = local_1c68._0_8_;
      uStack_11b0 = local_1c68._8_8_;
      local_11c8 = local_1d48._0_8_;
      uStack_11c0 = local_1d48._8_8_;
      local_1c68 = vpor_avx(auVar37,local_1d48);
      local_ad0 = local_1cb8;
      local_ad8 = local_1c98;
      local_ae0 = local_1cb8;
      local_518 = local_1c98._0_8_;
      uStack_510 = local_1c98._8_8_;
      local_528 = local_1cb8._0_8_;
      uStack_520 = local_1cb8._8_8_;
      local_1cb8._8_8_ = local_1c98._8_8_ ^ local_1cb8._8_8_;
      local_1cb8._0_8_ = local_1c98._0_8_ ^ local_1cb8._0_8_;
      local_538 = local_1c88._0_8_;
      uStack_530 = local_1c88._8_8_;
      local_548 = local_1ca8._0_8_;
      uStack_540 = local_1ca8._8_8_;
      local_1ca8._8_8_ = local_1c88._8_8_ ^ local_1ca8._8_8_;
      local_1ca8._0_8_ = local_1c88._0_8_ ^ local_1ca8._0_8_;
      local_ae8 = local_1cd8;
      local_af0 = local_1c78;
      local_af8 = local_1cd8;
      local_4d8 = local_1c78._0_8_;
      uStack_4d0 = local_1c78._8_8_;
      local_4e8 = local_1cd8._0_8_;
      uStack_4e0 = local_1cd8._8_8_;
      local_1cd8._8_8_ = local_1c78._8_8_ ^ local_1cd8._8_8_;
      local_1cd8._0_8_ = local_1c78._0_8_ ^ local_1cd8._0_8_;
      local_4f8 = local_1c68._0_8_;
      uStack_4f0 = local_1c68._8_8_;
      local_508 = local_1cc8._0_8_;
      uStack_500 = local_1cc8._8_8_;
      local_1cc8._8_8_ = local_1c68._8_8_ ^ local_1cc8._8_8_;
      local_1cc8._0_8_ = local_1c68._0_8_ ^ local_1cc8._0_8_;
      local_b00 = local_1cf8;
      local_b08 = local_1c58;
      local_b10 = local_1cf8;
      local_498 = local_1c58._0_8_;
      uStack_490 = local_1c58._8_8_;
      local_4a8 = local_1cf8._0_8_;
      uStack_4a0 = local_1cf8._8_8_;
      local_1cf8._8_8_ = local_1c58._8_8_ ^ local_1cf8._8_8_;
      local_1cf8._0_8_ = local_1c58._0_8_ ^ local_1cf8._0_8_;
      local_4b8 = local_1c48._0_8_;
      uStack_4b0 = local_1c48._8_8_;
      local_4c8 = local_1ce8._0_8_;
      uStack_4c0 = local_1ce8._8_8_;
      local_1ce8._8_8_ = local_1c48._8_8_ ^ local_1ce8._8_8_;
      local_1ce8._0_8_ = local_1c48._0_8_ ^ local_1ce8._0_8_;
    }
    else {
      local_1d68 = *(undefined8 *)(local_1b08 + (long)local_1cfc * 8);
      local_1d60 = (ulong)*(uint *)(local_1b08 + 0x90);
      w128_from_bitstream(in_stack_ffffffffffffe118._8_8_,in_stack_ffffffffffffe118._0_8_,
                          in_stack_ffffffffffffe108._8_8_,in_stack_ffffffffffffe108._0_8_);
      local_19a0 = local_1d88;
      local_19a8 = &local_1b58;
      local_19b0 = &local_1b38;
      local_818 = local_1b58;
      wStack_810 = wStack_1b50;
      auVar8._8_8_ = wStack_1b50;
      auVar8._0_8_ = local_1b58;
      local_828 = local_1b38;
      uStack_820 = uStack_1b30;
      auVar13._8_8_ = uStack_1b30;
      auVar13._0_8_ = local_1b38;
      auVar37 = vpand_avx(auVar8,auVar13);
      local_838 = local_1b48;
      wStack_830 = wStack_1b40;
      auVar26._8_8_ = wStack_1b40;
      auVar26._0_8_ = local_1b48;
      local_848 = local_1b28;
      uStack_840 = uStack_1b20;
      auVar31._8_8_ = uStack_1b20;
      auVar31._0_8_ = local_1b28;
      auVar39 = vpand_avx(auVar26,auVar31);
      local_19b8 = local_1da8;
      local_19c0 = &local_1b78;
      local_19c8 = &local_1b38;
      local_7d8 = local_1b78;
      wStack_7d0 = wStack_1b70;
      auVar2._8_8_ = wStack_1b70;
      auVar2._0_8_ = local_1b78;
      local_7e8 = local_1b38;
      uStack_7e0 = uStack_1b30;
      auVar14._8_8_ = uStack_1b30;
      auVar14._0_8_ = local_1b38;
      auVar38 = vpand_avx(auVar2,auVar14);
      local_7f8 = local_1b68;
      wStack_7f0 = wStack_1b60;
      auVar23._8_8_ = wStack_1b60;
      auVar23._0_8_ = local_1b68;
      local_808 = local_1b28;
      uStack_800 = uStack_1b20;
      auVar32._8_8_ = uStack_1b20;
      auVar32._0_8_ = local_1b28;
      auVar40 = vpand_avx(auVar23,auVar32);
      local_19d0 = local_1dc8;
      local_19d8 = &local_1b98;
      local_19e0 = &local_1b38;
      local_798 = local_1b98;
      wStack_790 = wStack_1b90;
      auVar1._8_8_ = wStack_1b90;
      auVar1._0_8_ = local_1b98;
      local_7a8 = local_1b38;
      uStack_7a0 = uStack_1b30;
      auVar15._8_8_ = uStack_1b30;
      auVar15._0_8_ = local_1b38;
      local_1dc8 = vpand_avx(auVar1,auVar15);
      local_7b8 = local_1b88;
      wStack_7b0 = wStack_1b80;
      auVar20._8_8_ = wStack_1b80;
      auVar20._0_8_ = local_1b88;
      local_7c8 = local_1b28;
      uStack_7c0 = uStack_1b20;
      auVar33._8_8_ = uStack_1b20;
      auVar33._0_8_ = local_1b28;
      local_1db8 = vpand_avx(auVar20,auVar33);
      local_1658 = vpsrldq_avx(auVar37,8);
      local_165c = 0x3e;
      local_1dd8 = vpsrlq_avx(local_1658,ZEXT416(0x3e));
      local_1678 = vpslldq_avx(auVar37,8);
      local_167c = 0x3e;
      auVar1 = vpsrlq_avx(local_1678,ZEXT416(0x3e));
      local_1d88._0_8_ = auVar37._0_8_;
      local_1d88._8_8_ = auVar37._8_8_;
      local_dd8 = local_1d88._0_8_;
      uStack_dd0 = local_1d88._8_8_;
      local_ddc = 2;
      local_11d8 = vpsllq_avx(auVar37,ZEXT416(2));
      local_1de8._0_8_ = auVar1._0_8_;
      local_1de8._8_8_ = auVar1._8_8_;
      local_11e8 = local_1de8._0_8_;
      uStack_11e0 = local_1de8._8_8_;
      local_1d88 = vpor_avx(local_11d8,auVar1);
      local_1698 = vpslldq_avx(auVar39,8);
      local_169c = 0x3e;
      local_1de8 = vpsrlq_avx(local_1698,ZEXT416(0x3e));
      local_1d78._0_8_ = auVar39._0_8_;
      local_1d78._8_8_ = auVar39._8_8_;
      local_df8 = local_1d78._0_8_;
      uStack_df0 = local_1d78._8_8_;
      local_dfc = 2;
      local_11f8 = vpsllq_avx(auVar39,ZEXT416(2));
      local_1208 = local_1de8._0_8_;
      uStack_1200 = local_1de8._8_8_;
      auVar37 = vpor_avx(local_11f8,local_1de8);
      local_1d78._0_8_ = auVar37._0_8_;
      local_1d78._8_8_ = auVar37._8_8_;
      local_1218 = local_1d78._0_8_;
      uStack_1210 = local_1d78._8_8_;
      local_1228 = local_1dd8._0_8_;
      uStack_1220 = local_1dd8._8_8_;
      local_1d78 = vpor_avx(auVar37,local_1dd8);
      local_16b8 = vpsrldq_avx(auVar38,8);
      local_16bc = 0x3f;
      local_1df8 = vpsrlq_avx(local_16b8,ZEXT416(0x3f));
      local_16d8 = vpslldq_avx(auVar38,8);
      local_16dc = 0x3f;
      auVar37 = vpsrlq_avx(local_16d8,ZEXT416(0x3f));
      local_1da8._0_8_ = auVar38._0_8_;
      local_1da8._8_8_ = auVar38._8_8_;
      local_e18 = local_1da8._0_8_;
      uStack_e10 = local_1da8._8_8_;
      local_e1c = 1;
      local_1238 = vpsllq_avx(auVar38,ZEXT416(1));
      local_1e08._0_8_ = auVar37._0_8_;
      local_1e08._8_8_ = auVar37._8_8_;
      local_1248 = local_1e08._0_8_;
      uStack_1240 = local_1e08._8_8_;
      local_1da8 = vpor_avx(local_1238,auVar37);
      local_16f8 = vpslldq_avx(auVar40,8);
      local_16fc = 0x3f;
      local_1e08 = vpsrlq_avx(local_16f8,ZEXT416(0x3f));
      local_1d98._0_8_ = auVar40._0_8_;
      local_1d98._8_8_ = auVar40._8_8_;
      local_e38 = local_1d98._0_8_;
      uStack_e30 = local_1d98._8_8_;
      local_e3c = 1;
      local_1258 = vpsllq_avx(auVar40,ZEXT416(1));
      local_1268 = local_1e08._0_8_;
      uStack_1260 = local_1e08._8_8_;
      auVar37 = vpor_avx(local_1258,local_1e08);
      local_1d98._0_8_ = auVar37._0_8_;
      local_1d98._8_8_ = auVar37._8_8_;
      local_1278 = local_1d98._0_8_;
      uStack_1270 = local_1d98._8_8_;
      local_1288 = local_1df8._0_8_;
      uStack_1280 = local_1df8._8_8_;
      local_1d98 = vpor_avx(auVar37,local_1df8);
      w128_from_bitstream(in_stack_ffffffffffffe118._8_8_,in_stack_ffffffffffffe118._0_8_,
                          in_stack_ffffffffffffe108._8_8_,in_stack_ffffffffffffe108._0_8_);
      local_19e8 = local_1e28;
      local_19f0 = &local_1b98;
      local_19f8 = &local_1b38;
      local_758 = local_1b98;
      wStack_750 = wStack_1b90;
      auVar40._8_8_ = wStack_1b90;
      auVar40._0_8_ = local_1b98;
      local_768 = local_1b38;
      uStack_760 = uStack_1b30;
      auVar16._8_8_ = uStack_1b30;
      auVar16._0_8_ = local_1b38;
      local_1e28 = vpand_avx(auVar40,auVar16);
      local_778 = local_1b88;
      wStack_770 = wStack_1b80;
      auVar21._8_8_ = wStack_1b80;
      auVar21._0_8_ = local_1b88;
      local_788 = local_1b28;
      uStack_780 = uStack_1b20;
      auVar34._8_8_ = uStack_1b20;
      auVar34._0_8_ = local_1b28;
      local_1e18 = vpand_avx(auVar21,auVar34);
      local_1a00 = local_1e48;
      local_1a08 = &local_1b78;
      local_1a10 = &local_1b38;
      local_718 = local_1b78;
      wStack_710 = wStack_1b70;
      auVar6._8_8_ = wStack_1b70;
      auVar6._0_8_ = local_1b78;
      local_728 = local_1b38;
      uStack_720 = uStack_1b30;
      auVar17._8_8_ = uStack_1b30;
      auVar17._0_8_ = local_1b38;
      auVar37 = vpand_avx(auVar6,auVar17);
      local_738 = local_1b68;
      wStack_730 = wStack_1b60;
      auVar24._8_8_ = wStack_1b60;
      auVar24._0_8_ = local_1b68;
      local_748 = local_1b28;
      uStack_740 = uStack_1b20;
      auVar35._8_8_ = uStack_1b20;
      auVar35._0_8_ = local_1b28;
      auVar39 = vpand_avx(auVar24,auVar35);
      local_1a18 = local_1e68;
      local_1a20 = &local_1b58;
      local_1a28 = &local_1b38;
      local_6d8 = local_1b58;
      wStack_6d0 = wStack_1b50;
      auVar9._8_8_ = wStack_1b50;
      auVar9._0_8_ = local_1b58;
      local_6e8 = local_1b38;
      uStack_6e0 = uStack_1b30;
      auVar18._8_8_ = uStack_1b30;
      auVar18._0_8_ = local_1b38;
      auVar38 = vpand_avx(auVar9,auVar18);
      local_6f8 = local_1b48;
      wStack_6f0 = wStack_1b40;
      auVar27._8_8_ = wStack_1b40;
      auVar27._0_8_ = local_1b48;
      local_708 = local_1b28;
      uStack_700 = uStack_1b20;
      auVar36._8_8_ = uStack_1b20;
      auVar36._0_8_ = local_1b28;
      auVar40 = vpand_avx(auVar27,auVar36);
      local_1718 = vpsrldq_avx(auVar38,8);
      local_171c = 0x3e;
      auVar1 = vpsrlq_avx(local_1718,ZEXT416(0x3e));
      local_1738 = vpslldq_avx(auVar38,8);
      local_173c = 0x3e;
      auVar2 = vpsrlq_avx(local_1738,ZEXT416(0x3e));
      local_1e68._0_8_ = auVar38._0_8_;
      local_1e68._8_8_ = auVar38._8_8_;
      local_e58 = local_1e68._0_8_;
      uStack_e50 = local_1e68._8_8_;
      local_e5c = 2;
      local_1298 = vpsllq_avx(auVar38,ZEXT416(2));
      local_1e88 = auVar2._0_8_;
      uStack_1e80 = auVar2._8_8_;
      local_12a8 = local_1e88;
      uStack_12a0 = uStack_1e80;
      local_1e68 = vpor_avx(local_1298,auVar2);
      local_1758 = vpslldq_avx(auVar40,8);
      local_175c = 0x3e;
      auVar38 = vpsrlq_avx(local_1758,ZEXT416(0x3e));
      local_1e58._0_8_ = auVar40._0_8_;
      local_1e58._8_8_ = auVar40._8_8_;
      local_e78 = local_1e58._0_8_;
      uStack_e70 = local_1e58._8_8_;
      local_e7c = 2;
      local_12b8 = vpsllq_avx(auVar40,ZEXT416(2));
      local_1e88 = auVar38._0_8_;
      uStack_1e80 = auVar38._8_8_;
      local_12c8 = local_1e88;
      uStack_12c0 = uStack_1e80;
      auVar38 = vpor_avx(local_12b8,auVar38);
      local_1e58._0_8_ = auVar38._0_8_;
      local_1e58._8_8_ = auVar38._8_8_;
      local_1e78 = auVar1._0_8_;
      uStack_1e70 = auVar1._8_8_;
      local_12d8 = local_1e58._0_8_;
      uStack_12d0 = local_1e58._8_8_;
      local_12e8 = local_1e78;
      uStack_12e0 = uStack_1e70;
      local_1e58 = vpor_avx(auVar38,auVar1);
      local_1778 = vpsrldq_avx(auVar37,8);
      local_177c = 0x3f;
      auVar38 = vpsrlq_avx(local_1778,ZEXT416(0x3f));
      local_1798 = vpslldq_avx(auVar37,8);
      local_179c = 0x3f;
      auVar40 = vpsrlq_avx(local_1798,ZEXT416(0x3f));
      local_1e48._0_8_ = auVar37._0_8_;
      local_1e48._8_8_ = auVar37._8_8_;
      local_e98 = local_1e48._0_8_;
      uStack_e90 = local_1e48._8_8_;
      local_e9c = 1;
      local_12f8 = vpsllq_avx(auVar37,ZEXT416(1));
      local_1ea8 = auVar40._0_8_;
      uStack_1ea0 = auVar40._8_8_;
      local_1308 = local_1ea8;
      uStack_1300 = uStack_1ea0;
      local_1e48 = vpor_avx(local_12f8,auVar40);
      local_17b8 = vpslldq_avx(auVar39,8);
      local_17bc = 0x3f;
      auVar37 = vpsrlq_avx(local_17b8,ZEXT416(0x3f));
      local_1e38._0_8_ = auVar39._0_8_;
      local_1e38._8_8_ = auVar39._8_8_;
      local_eb8 = local_1e38._0_8_;
      uStack_eb0 = local_1e38._8_8_;
      local_ebc = 1;
      local_1318 = vpsllq_avx(auVar39,ZEXT416(1));
      local_1ea8 = auVar37._0_8_;
      uStack_1ea0 = auVar37._8_8_;
      local_1328 = local_1ea8;
      uStack_1320 = uStack_1ea0;
      auVar37 = vpor_avx(local_1318,auVar37);
      local_1e38._0_8_ = auVar37._0_8_;
      local_1e38._8_8_ = auVar37._8_8_;
      local_1e98 = auVar38._0_8_;
      uStack_1e90 = auVar38._8_8_;
      local_1338 = local_1e38._0_8_;
      uStack_1330 = local_1e38._8_8_;
      local_1348 = local_1e98;
      uStack_1340 = uStack_1e90;
      local_1e38 = vpor_avx(auVar37,auVar38);
      local_1a30 = local_1c58;
      local_1a38 = local_1bb8;
      local_1a40 = local_1da8;
      local_698 = local_1bb8._0_8_;
      uStack_690 = local_1bb8._8_8_;
      local_6a8 = local_1da8._0_8_;
      uStack_6a0 = local_1da8._8_8_;
      local_1c58 = vpand_avx(local_1bb8,local_1da8);
      local_6b8 = local_1ba8._0_8_;
      uStack_6b0 = local_1ba8._8_8_;
      local_6c8 = local_1d98._0_8_;
      uStack_6c0 = local_1d98._8_8_;
      auVar37 = vpand_avx(local_1ba8,local_1d98);
      local_1a48 = local_1c78;
      local_1a50 = local_1bd8;
      local_1a58 = local_1d88;
      local_658 = local_1bd8._0_8_;
      uStack_650 = local_1bd8._8_8_;
      local_668 = local_1d88._0_8_;
      uStack_660 = local_1d88._8_8_;
      auVar39 = vpand_avx(local_1bd8,local_1d88);
      local_678 = local_1bc8._0_8_;
      uStack_670 = local_1bc8._8_8_;
      local_688 = local_1d78._0_8_;
      uStack_680 = local_1d78._8_8_;
      auVar38 = vpand_avx(local_1bc8,local_1d78);
      local_b18 = local_1c58;
      local_b20 = local_1c58;
      local_b28 = local_1c78;
      local_458 = local_1c58._0_8_;
      uStack_450 = local_1c58._8_8_;
      local_1c78._0_8_ = auVar39._0_8_;
      local_468 = local_1c78._0_8_;
      local_1c78._8_8_ = auVar39._8_8_;
      uStack_460 = local_1c78._8_8_;
      uVar3 = local_1c58._8_8_ ^ local_1c78._8_8_;
      local_1c58._0_8_ = local_1c58._0_8_ ^ local_1c78._0_8_;
      local_1c58._8_8_ = uVar3;
      local_1c48._0_8_ = auVar37._0_8_;
      local_478 = local_1c48._0_8_;
      local_1c48._8_8_ = auVar37._8_8_;
      uStack_470 = local_1c48._8_8_;
      local_1c68._0_8_ = auVar38._0_8_;
      local_488 = local_1c68._0_8_;
      local_1c68._8_8_ = auVar38._8_8_;
      uStack_480 = local_1c68._8_8_;
      local_438 = local_1c48._0_8_ ^ local_1c68._0_8_;
      uStack_430 = local_1c48._8_8_ ^ local_1c68._8_8_;
      local_b30 = &local_1b38;
      local_b38 = local_1c58;
      local_b40 = local_1e28;
      local_1c58._0_8_ = SUB168(local_1c58,0);
      local_418 = local_1c58._0_8_;
      local_1c58._8_8_ = SUB168(local_1c58,8);
      uStack_410 = local_1c58._8_8_;
      local_428 = local_1e28._0_8_;
      uStack_420 = local_1e28._8_8_;
      local_3d8 = local_1c58._0_8_ ^ local_1e28._0_8_;
      uStack_3d0 = local_1c58._8_8_ ^ local_1e28._8_8_;
      local_448 = local_1e18._0_8_;
      uStack_440 = local_1e18._8_8_;
      local_3f8 = local_438 ^ local_1e18._0_8_;
      uStack_3f0 = uStack_430 ^ local_1e18._8_8_;
      local_b48 = local_1cb8;
      local_b50 = &local_1b38;
      local_b58 = local_1cb8;
      local_3e8 = local_1cb8._0_8_;
      uStack_3e0 = local_1cb8._8_8_;
      local_1cb8._8_8_ = uStack_3d0 ^ local_1cb8._8_8_;
      local_1cb8._0_8_ = local_3d8 ^ local_1cb8._0_8_;
      local_408 = local_1ca8._0_8_;
      uStack_400 = local_1ca8._8_8_;
      local_1ca8._8_8_ = uStack_3f0 ^ local_1ca8._8_8_;
      local_1ca8._0_8_ = local_3f8 ^ local_1ca8._0_8_;
      local_1a60 = local_1c58;
      local_1a68 = local_1bd8;
      local_1a70 = local_1dc8;
      local_618 = local_1bd8._0_8_;
      uStack_610 = local_1bd8._8_8_;
      local_628 = local_1dc8._0_8_;
      uStack_620 = local_1dc8._8_8_;
      local_1c58 = vpand_avx(local_1bd8,local_1dc8);
      local_638 = local_1bc8._0_8_;
      uStack_630 = local_1bc8._8_8_;
      local_648 = local_1db8._0_8_;
      uStack_640 = local_1db8._8_8_;
      local_1c48 = vpand_avx(local_1bc8,local_1db8);
      local_1a78 = local_1c78;
      local_1a80 = local_1bf8;
      local_1a88 = local_1da8;
      local_5d8 = local_1bf8._0_8_;
      uStack_5d0 = local_1bf8._8_8_;
      local_5e8 = local_1da8._0_8_;
      uStack_5e0 = local_1da8._8_8_;
      auVar37 = vpand_avx(local_1bf8,local_1da8);
      local_5f8 = local_1be8._0_8_;
      uStack_5f0 = local_1be8._8_8_;
      local_608 = local_1d98._0_8_;
      uStack_600 = local_1d98._8_8_;
      auVar39 = vpand_avx(local_1be8,local_1d98);
      local_b60 = local_1c58;
      local_b68 = local_1c58;
      local_b70 = local_1c78;
      local_398 = local_1c58._0_8_;
      uStack_390 = local_1c58._8_8_;
      local_1c78._0_8_ = auVar37._0_8_;
      local_3a8 = local_1c78._0_8_;
      local_1c78._8_8_ = auVar37._8_8_;
      uStack_3a0 = local_1c78._8_8_;
      uVar3 = local_1c58._8_8_ ^ local_1c78._8_8_;
      local_1c58._0_8_ = local_1c58._0_8_ ^ local_1c78._0_8_;
      local_1c58._8_8_ = uVar3;
      local_3b8 = local_1c48._0_8_;
      uStack_3b0 = local_1c48._8_8_;
      local_1c68._0_8_ = auVar39._0_8_;
      local_3c8 = local_1c68._0_8_;
      local_1c68._8_8_ = auVar39._8_8_;
      uStack_3c0 = local_1c68._8_8_;
      local_378 = local_1c48._0_8_ ^ local_1c68._0_8_;
      uStack_370 = local_1c48._8_8_ ^ local_1c68._8_8_;
      local_1c48._0_8_ = local_378;
      local_1c48._8_8_ = uStack_370;
      local_b78 = local_1c58;
      local_b80 = local_1c58;
      local_b88 = local_1e48;
      local_358 = local_1c58._0_8_;
      uStack_350 = local_1c58._8_8_;
      local_368 = local_1e48._0_8_;
      uStack_360 = local_1e48._8_8_;
      uVar3 = local_1c58._8_8_ ^ local_1e48._8_8_;
      local_1c58._0_8_ = local_1c58._0_8_ ^ local_1e48._0_8_;
      local_1c58._8_8_ = uVar3;
      local_388 = local_1e38._0_8_;
      uStack_380 = local_1e38._8_8_;
      local_338 = local_378 ^ local_1e38._0_8_;
      uStack_330 = uStack_370 ^ local_1e38._8_8_;
      local_1c48._0_8_ = local_338;
      local_1c48._8_8_ = uStack_330;
      local_b90 = local_1cd8;
      local_b98 = local_1c58;
      local_ba0 = local_1cd8;
      local_318 = local_1c58._0_8_;
      uStack_310 = local_1c58._8_8_;
      local_328 = local_1cd8._0_8_;
      uStack_320 = local_1cd8._8_8_;
      local_1cd8._8_8_ = local_1c58._8_8_ ^ local_1cd8._8_8_;
      local_1cd8._0_8_ = local_1c58._0_8_ ^ local_1cd8._0_8_;
      local_348 = local_1cc8._0_8_;
      uStack_340 = local_1cc8._8_8_;
      local_1cc8._8_8_ = uStack_330 ^ local_1cc8._8_8_;
      local_1cc8._0_8_ = local_338 ^ local_1cc8._0_8_;
      local_ed8 = vpslldq_avx(local_1c48,8);
      local_edc = 0x3f;
      auVar39 = vpsllq_avx(local_ed8,ZEXT416(0x3f));
      local_ef8 = vpsrldq_avx(local_1c58,8);
      local_efc = 0x3f;
      auVar37 = vpsllq_avx(local_ef8,ZEXT416(0x3f));
      local_17d8 = local_1c58._0_8_;
      uStack_17d0 = local_1c58._8_8_;
      local_17dc = 1;
      local_1358 = vpsrlq_avx(local_1c58,ZEXT416(1));
      local_1ec8 = auVar37._0_8_;
      uStack_1ec0 = auVar37._8_8_;
      local_1368 = local_1ec8;
      uStack_1360 = uStack_1ec0;
      auVar37 = vpor_avx(local_1358,auVar37);
      local_f18 = vpsrldq_avx(local_1c48,8);
      local_f1c = 0x3f;
      auVar38 = vpsllq_avx(local_f18,ZEXT416(0x3f));
      local_17f8 = local_1c48._0_8_;
      uStack_17f0 = local_1c48._8_8_;
      local_17fc = 1;
      local_1378 = vpsrlq_avx(local_1c48,ZEXT416(1));
      local_1ec8 = auVar38._0_8_;
      uStack_1ec0 = auVar38._8_8_;
      local_1388 = local_1ec8;
      uStack_1380 = uStack_1ec0;
      vpor_avx(local_1378,auVar38);
      local_1c58._0_8_ = auVar37._0_8_;
      local_1c58._8_8_ = auVar37._8_8_;
      local_1eb8 = auVar39._0_8_;
      uStack_1eb0 = auVar39._8_8_;
      local_1398 = local_1c58._0_8_;
      uStack_1390 = local_1c58._8_8_;
      local_13a8 = local_1eb8;
      uStack_13a0 = uStack_1eb0;
      auVar37 = vpor_avx(auVar37,auVar39);
      local_ba8 = &local_1b38;
      local_bb0 = &local_1b38;
      local_bb8 = local_1c58;
      local_1c58._0_8_ = auVar37._0_8_;
      local_2e8 = local_1c58._0_8_;
      local_1c58._8_8_ = auVar37._8_8_;
      uStack_2e0 = local_1c58._8_8_;
      local_1d8 = local_3d8 ^ local_1c58._0_8_;
      uStack_1d0 = uStack_3d0 ^ local_1c58._8_8_;
      local_308 = local_1c48._0_8_;
      uStack_300 = local_1c48._8_8_;
      local_1f8 = local_3f8 ^ local_1c48._0_8_;
      uStack_1f0 = uStack_3f0 ^ local_1c48._8_8_;
      local_1a90 = local_1c58;
      local_1a98 = local_1bf8;
      local_1aa0 = local_1d88;
      local_598 = local_1bf8._0_8_;
      uStack_590 = local_1bf8._8_8_;
      local_5a8 = local_1d88._0_8_;
      uStack_5a0 = local_1d88._8_8_;
      local_1c58 = vpand_avx(local_1bf8,local_1d88);
      local_5b8 = local_1be8._0_8_;
      uStack_5b0 = local_1be8._8_8_;
      local_5c8 = local_1d78._0_8_;
      uStack_5c0 = local_1d78._8_8_;
      local_1c48 = vpand_avx(local_1be8,local_1d78);
      local_1aa8 = local_1c78;
      local_1ab0 = local_1bb8;
      local_1ab8 = local_1dc8;
      local_558 = local_1bb8._0_8_;
      uStack_550 = local_1bb8._8_8_;
      local_568 = local_1dc8._0_8_;
      uStack_560 = local_1dc8._8_8_;
      local_1c78 = vpand_avx(local_1bb8,local_1dc8);
      local_578 = local_1ba8._0_8_;
      uStack_570 = local_1ba8._8_8_;
      local_588 = local_1db8._0_8_;
      uStack_580 = local_1db8._8_8_;
      local_1c68 = vpand_avx(local_1ba8,local_1db8);
      local_bc0 = local_1c58;
      local_bc8 = local_1c58;
      local_bd0 = local_1c78;
      local_298 = local_1c58._0_8_;
      uStack_290 = local_1c58._8_8_;
      local_2a8 = local_1c78._0_8_;
      uStack_2a0 = local_1c78._8_8_;
      uVar3 = local_1c58._8_8_ ^ local_1c78._8_8_;
      local_1c58._0_8_ = local_1c58._0_8_ ^ local_1c78._0_8_;
      local_1c58._8_8_ = uVar3;
      local_2b8 = local_1c48._0_8_;
      uStack_2b0 = local_1c48._8_8_;
      local_2c8 = local_1c68._0_8_;
      uStack_2c0 = local_1c68._8_8_;
      local_278 = local_1c48._0_8_ ^ local_1c68._0_8_;
      uStack_270 = local_1c48._8_8_ ^ local_1c68._8_8_;
      local_1c48._0_8_ = local_278;
      local_1c48._8_8_ = uStack_270;
      local_bd8 = local_1c58;
      local_be0 = local_1c58;
      local_be8 = local_1e68;
      local_258 = local_1c58._0_8_;
      uStack_250 = local_1c58._8_8_;
      local_268 = local_1e68._0_8_;
      uStack_260 = local_1e68._8_8_;
      uVar3 = local_1c58._8_8_ ^ local_1e68._8_8_;
      local_1c58._0_8_ = local_1c58._0_8_ ^ local_1e68._0_8_;
      local_1c58._8_8_ = uVar3;
      local_288 = local_1e58._0_8_;
      uStack_280 = local_1e58._8_8_;
      local_238 = local_278 ^ local_1e58._0_8_;
      uStack_230 = uStack_270 ^ local_1e58._8_8_;
      local_1c48._0_8_ = local_238;
      local_1c48._8_8_ = uStack_230;
      local_bf0 = local_1cf8;
      local_bf8 = local_1c58;
      local_c00 = local_1cf8;
      local_218 = local_1c58._0_8_;
      uStack_210 = local_1c58._8_8_;
      local_228 = local_1cf8._0_8_;
      uStack_220 = local_1cf8._8_8_;
      local_1cf8._8_8_ = local_1c58._8_8_ ^ local_1cf8._8_8_;
      local_1cf8._0_8_ = local_1c58._0_8_ ^ local_1cf8._0_8_;
      local_248 = local_1ce8._0_8_;
      uStack_240 = local_1ce8._8_8_;
      local_1ce8._8_8_ = uStack_230 ^ local_1ce8._8_8_;
      local_1ce8._0_8_ = local_238 ^ local_1ce8._0_8_;
      local_f38 = vpslldq_avx(local_1c48,8);
      local_f3c = 0x3e;
      auVar38 = vpsllq_avx(local_f38,ZEXT416(0x3e));
      local_f58 = vpsrldq_avx(local_1c58,8);
      local_f5c = 0x3e;
      auVar37 = vpsllq_avx(local_f58,ZEXT416(0x3e));
      local_1818 = local_1c58._0_8_;
      uStack_1810 = local_1c58._8_8_;
      local_181c = 2;
      local_13b8 = vpsrlq_avx(local_1c58,ZEXT416(2));
      local_13c8 = auVar37._0_8_;
      uStack_13c0 = auVar37._8_8_;
      auVar37 = vpor_avx(local_13b8,auVar37);
      local_f78 = vpsrldq_avx(local_1c48,8);
      local_f7c = 0x3e;
      in_stack_ffffffffffffe118 = vpsllq_avx(local_f78,ZEXT416(0x3e));
      local_1838 = local_1c48._0_8_;
      uStack_1830 = local_1c48._8_8_;
      local_183c = 2;
      local_13d8 = vpsrlq_avx(local_1c48,ZEXT416(2));
      local_13e8 = in_stack_ffffffffffffe118._0_8_;
      uStack_13e0 = in_stack_ffffffffffffe118._8_8_;
      auVar39 = vpor_avx(local_13d8,in_stack_ffffffffffffe118);
      local_1c58._0_8_ = auVar37._0_8_;
      local_1c58._8_8_ = auVar37._8_8_;
      local_1ed8 = auVar38._0_8_;
      uStack_1ed0 = auVar38._8_8_;
      local_13f8 = local_1c58._0_8_;
      uStack_13f0 = local_1c58._8_8_;
      local_1408 = local_1ed8;
      uStack_1400 = uStack_1ed0;
      local_1c58 = vpor_avx(auVar37,auVar38);
      local_c08 = &local_1b38;
      local_c10 = &local_1b38;
      local_c18 = local_1c58;
      local_1e8 = local_1c58._0_8_;
      uStack_1e0 = local_1c58._8_8_;
      local_1b38 = local_1d8 ^ local_1c58._0_8_;
      uStack_1b30 = uStack_1d0 ^ local_1c58._8_8_;
      local_208 = local_1c48._0_8_;
      uStack_200 = local_1c48._8_8_;
      local_1b28 = local_1f8 ^ local_1c48._0_8_;
      uStack_1b20 = uStack_1f0 ^ local_1c48._8_8_;
      local_1c48 = auVar39;
      local_2f8 = local_3f8;
      uStack_2f0 = uStack_3f0;
      local_2d8 = local_3d8;
      uStack_2d0 = uStack_3d0;
      w128_to_bitstream(local_13e8,in_stack_ffffffffffffe108._8_8_,in_stack_ffffffffffffe108._0_8_,
                        local_1f08);
    }
  }
  *(int *)(local_1b08 + 0x90) = *(int *)(local_1b08 + 0x90) + 0x81;
  *(int *)(local_1b08 + 0x90) = *(int *)(local_1b08 + 0x90) + 0x81;
  *(long *)(local_1b10 + 0x80) = *(long *)(local_1b10 + 0x80) + 0x81;
  local_1c58._0_8_ = local_1cd8._0_8_ ^ local_1bb8._0_8_;
  local_1c58._8_8_ = local_1cd8._8_8_ ^ local_1bb8._8_8_;
  local_1c48._0_8_ = local_1cc8._0_8_ ^ local_1ba8._0_8_;
  local_1c48._8_8_ = local_1cc8._8_8_ ^ local_1ba8._8_8_;
  uVar3 = local_1bb8._8_8_ ^ local_1bd8._8_8_;
  local_1bb8._0_8_ = local_1bb8._0_8_ ^ local_1bd8._0_8_;
  local_1bb8._8_8_ = uVar3;
  local_1bb8._0_8_ = SUB168(local_1bb8,0);
  local_1bb8._8_8_ = SUB168(local_1bb8,8);
  local_1c78._0_8_ = local_1cf8._0_8_ ^ local_1bb8._0_8_;
  local_1c78._8_8_ = local_1cf8._8_8_ ^ local_1bb8._8_8_;
  local_1c68._0_8_ = local_1ce8._0_8_ ^ local_1ba8._0_8_ ^ local_1bc8._0_8_;
  local_1c68._8_8_ = local_1ce8._8_8_ ^ local_1ba8._8_8_ ^ local_1bc8._8_8_;
  auVar37 = vpslldq_avx(local_1c48,8);
  auVar39 = vpsllq_avx(auVar37,ZEXT416(0x3e));
  auVar37 = vpsrldq_avx(local_1c58,8);
  auVar37 = vpsllq_avx(auVar37,ZEXT416(0x3e));
  auVar38 = vpsrlq_avx(local_1c58,ZEXT416(2));
  auVar37 = vpor_avx(auVar38,auVar37);
  auVar38 = vpsrldq_avx(local_1c48,8);
  auVar38 = vpsllq_avx(auVar38,ZEXT416(0x3e));
  auVar40 = vpsrlq_avx(local_1c48,ZEXT416(2));
  vpor_avx(auVar40,auVar38);
  auVar37 = vpor_avx(auVar37,auVar39);
  auVar39 = vpslldq_avx(local_1c68,8);
  auVar38 = vpsllq_avx(auVar39,ZEXT416(0x3f));
  auVar39 = vpsrldq_avx(local_1c78,8);
  auVar39 = vpsllq_avx(auVar39,ZEXT416(0x3f));
  auVar40 = vpsrlq_avx(local_1c78,ZEXT416(1));
  auVar39 = vpor_avx(auVar40,auVar39);
  auVar40 = vpsrldq_avx(local_1c68,8);
  auVar40 = vpsllq_avx(auVar40,ZEXT416(0x3f));
  auVar1 = vpsrlq_avx(local_1c68,ZEXT416(1));
  vpor_avx(auVar1,auVar40);
  auVar39 = vpor_avx(auVar39,auVar38);
  local_1c78._0_8_ = auVar39._0_8_;
  local_1c78._8_8_ = auVar39._8_8_;
  local_1c58._0_8_ = auVar37._0_8_;
  local_1c58._8_8_ = auVar37._8_8_;
  *(undefined8 *)*local_1b00 =
       local_1cb8._0_8_ ^ local_1bb8._0_8_ ^ local_1bf8._0_8_ ^ local_1c78._0_8_ ^ local_1c58._0_8_;
  *(undefined8 *)(*local_1b00 + 8) =
       local_1cb8._8_8_ ^ local_1bb8._8_8_ ^ local_1bf8._8_8_ ^ local_1c78._8_8_ ^ local_1c58._8_8_;
  *(undefined8 *)local_1b00[1] =
       local_1ca8._0_8_ ^ local_1ba8._0_8_ ^ local_1bc8._0_8_ ^ local_1be8._0_8_ ^ local_1c68._0_8_
       ^ local_1c48._0_8_;
  *(undefined8 *)(local_1b00[1] + 8) =
       local_1ca8._8_8_ ^ local_1ba8._8_8_ ^ local_1bc8._8_8_ ^ local_1be8._8_8_ ^ local_1c68._8_8_
       ^ local_1c48._8_8_;
  return;
}

Assistant:

ATTR_TARGET_S128
static void picnic3_mpc_sbox_s128_lowmc_129_129_4(mzd_local_t* statein, randomTape_t* tapes,
                                                  msgs_t* msgs) {
  picnic3_mpc_sbox_bitsliced_mm128(LOWMC_129_129_4_N, mm128_xor_256, mm128_and_256,
                                   mm128_shift_left_256, mm128_shift_right_256, mask_129_129_43_a,
                                   mask_129_129_43_b, mask_129_129_43_c);
}